

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_Set2ndOutputChannel(PaUtilBufferProcessor *bp,uint channel,void *data,uint stride)

{
  uint stride_local;
  void *data_local;
  uint channel_local;
  PaUtilBufferProcessor *bp_local;
  
  if (bp->outputChannelCount <= channel) {
    __assert_fail("channel < bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                  ,0x275,
                  "void PaUtil_Set2ndOutputChannel(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (data != (void *)0x0) {
    bp->hostOutputChannels[1][channel].data = data;
    bp->hostOutputChannels[1][channel].stride = stride;
    return;
  }
  __assert_fail("data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                ,0x276,
                "void PaUtil_Set2ndOutputChannel(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_Set2ndOutputChannel( PaUtilBufferProcessor* bp,
        unsigned int channel, void *data, unsigned int stride )
{
    assert( channel < bp->outputChannelCount );
    assert( data != NULL );

    bp->hostOutputChannels[1][channel].data = data;
    bp->hostOutputChannels[1][channel].stride = stride;
}